

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

jvirt_barray_ptr *
jtransform_adjust_parameters
          (j_decompress_ptr srcinfo,j_compress_ptr dstinfo,jvirt_barray_ptr *src_coef_arrays,
          jpeg_transform_info *info)

{
  undefined8 uVar1;
  JXFORM_CODE JVar2;
  int iVar3;
  int iVar4;
  jpeg_error_mgr *pjVar5;
  jpeg_component_info *pjVar6;
  jpeg_saved_marker_ptr_conflict pjVar7;
  JOCTET *pJVar8;
  j_decompress_ptr cinfo;
  jvirt_barray_ptr *ppjVar9;
  jvirt_barray_ptr pjVar10;
  JQUANT_TBL *qtblptr1;
  short sVar11;
  JBLOCKARRAY ppaJVar12;
  JQUANT_TBL *pJVar13;
  ulong uVar14;
  short sVar15;
  UINT16 UVar16;
  uint uVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  JDIMENSION JVar21;
  JQUANT_TBL *pJVar22;
  jpeg_component_info *compptr;
  uint uVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  JBLOCKROW paJVar27;
  ulong uVar28;
  JQUANT_TBL *qtblptr;
  
  if (info->force_grayscale == 0) {
    if (info->num_components == 1) {
      pjVar6 = dstinfo->comp_info;
      pjVar6->h_samp_factor = 1;
      pjVar6->v_samp_factor = 1;
    }
  }
  else {
    if (dstinfo->jpeg_color_space == JCS_GRAYSCALE) {
      if (dstinfo->num_components == 1) goto LAB_00112ebe;
    }
    else if ((dstinfo->jpeg_color_space == JCS_YCbCr) && (dstinfo->num_components == 3)) {
LAB_00112ebe:
      if ((srcinfo->comp_info->h_samp_factor == srcinfo->max_h_samp_factor) &&
         (srcinfo->comp_info->v_samp_factor == srcinfo->max_v_samp_factor)) {
        iVar3 = dstinfo->comp_info->quant_tbl_no;
        jpeg_set_colorspace(dstinfo,JCS_GRAYSCALE);
        dstinfo->comp_info->quant_tbl_no = iVar3;
        goto LAB_00112f0c;
      }
    }
    pjVar5 = dstinfo->err;
    pjVar5->msg_code = 0x1b;
    (*pjVar5->error_exit)((j_common_ptr)dstinfo);
  }
LAB_00112f0c:
  JVar2 = info->transform;
  if (2 < JVar2 - JXFORM_TRANSPOSE) {
    if (JVar2 == JXFORM_DROP) {
      if (((info->drop_width != 0) && (info->drop_height != 0)) && (0 < dstinfo->num_components)) {
        cinfo = info->drop_ptr;
        ppjVar9 = info->drop_coef_arrays;
        iVar3 = info->trim;
        lVar19 = 0;
        do {
          if (cinfo->num_components <= lVar19) break;
          pjVar6 = cinfo->comp_info + lVar19;
          pJVar13 = srcinfo->comp_info[lVar19].quant_table;
          compptr = srcinfo->comp_info + lVar19;
          pJVar22 = cinfo->comp_info[lVar19].quant_table;
          lVar20 = 0;
          do {
            if (pJVar13->quantval[lVar20] != pJVar22->quantval[lVar20]) {
              if (iVar3 == 0) {
                qtblptr1 = dstinfo->quant_tbl_ptrs[compptr->quant_tbl_no];
                lVar20 = 0;
                do {
                  uVar18 = (uint)pJVar22->quantval[lVar20];
                  uVar23 = (uint)pJVar13->quantval[lVar20];
                  if (pJVar13->quantval[lVar20] != pJVar22->quantval[lVar20]) {
                    do {
                      uVar17 = uVar18;
                      UVar16 = (UINT16)uVar17;
                      uVar18 = (int)(short)uVar23 % (int)(short)UVar16;
                      uVar23 = uVar17;
                    } while (uVar18 != 0);
                    qtblptr1->quantval[lVar20] = UVar16;
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 0x40);
                dequant_comp(srcinfo,compptr,src_coef_arrays[lVar19],qtblptr1);
                dequant_comp(cinfo,pjVar6,ppjVar9[lVar19],qtblptr1);
              }
              else if (pjVar6->height_in_blocks != 0) {
                pjVar10 = ppjVar9[lVar19];
                uVar14 = (ulong)(uint)pjVar6->v_samp_factor;
                JVar21 = 0;
                do {
                  ppaJVar12 = (*cinfo->mem->access_virt_barray)
                                        ((j_common_ptr)cinfo,pjVar10,JVar21,(JDIMENSION)uVar14,1);
                  iVar4 = pjVar6->v_samp_factor;
                  uVar14 = (ulong)iVar4;
                  if (0 < (long)uVar14) {
                    uVar18 = pjVar6->width_in_blocks;
                    uVar26 = 0;
                    do {
                      if ((ulong)uVar18 != 0) {
                        paJVar27 = ppaJVar12[uVar26];
                        uVar28 = 0;
                        do {
                          lVar20 = 0;
                          do {
                            UVar16 = pJVar13->quantval[lVar20];
                            if (pJVar22->quantval[lVar20] != UVar16) {
                              sVar11 = pJVar22->quantval[lVar20] * (*paJVar27)[lVar20];
                              sVar15 = (short)((uint)(int)(short)UVar16 >> 1);
                              if (sVar11 < 0) {
                                sVar15 = sVar15 - sVar11;
                                if (sVar15 < (short)UVar16) {
                                  sVar11 = 0;
                                }
                                else {
                                  sVar11 = sVar15 / (short)UVar16;
                                }
                                sVar11 = -sVar11;
                              }
                              else {
                                sVar11 = sVar11 + sVar15;
                                if (sVar11 < (short)UVar16) {
                                  sVar11 = 0;
                                }
                                else {
                                  sVar11 = sVar11 / (short)UVar16;
                                }
                              }
                              (*paJVar27)[lVar20] = sVar11;
                            }
                            lVar20 = lVar20 + 1;
                          } while (lVar20 != 0x40);
                          uVar28 = uVar28 + 1;
                          paJVar27 = paJVar27 + 1;
                        } while (uVar28 != uVar18);
                      }
                      uVar26 = uVar26 + 1;
                    } while (uVar26 != uVar14);
                  }
                  JVar21 = JVar21 + iVar4;
                } while (JVar21 < pjVar6->height_in_blocks);
              }
              break;
            }
            lVar20 = lVar20 + 1;
          } while (lVar20 != 0x40);
          lVar19 = lVar19 + 1;
        } while (lVar19 < dstinfo->num_components);
      }
      goto LAB_00112fbb;
    }
    if (JVar2 != JXFORM_ROT_270) {
      JVar21 = info->output_height;
      dstinfo->image_width = info->output_width;
      dstinfo->image_height = JVar21;
      goto LAB_00112fbb;
    }
  }
  JVar21 = info->output_height;
  dstinfo->image_width = info->output_width;
  dstinfo->image_height = JVar21;
  iVar3 = dstinfo->num_components;
  if (0 < (long)iVar3) {
    pjVar6 = dstinfo->comp_info;
    lVar19 = 0;
    do {
      uVar1 = *(undefined8 *)((long)&pjVar6->h_samp_factor + lVar19);
      *(ulong *)((long)&pjVar6->h_samp_factor + lVar19) =
           CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
      lVar19 = lVar19 + 0x60;
    } while ((long)iVar3 * 0x60 != lVar19);
  }
  lVar19 = 0;
  do {
    pJVar13 = dstinfo->quant_tbl_ptrs[lVar19];
    if (pJVar13 != (JQUANT_TBL *)0x0) {
      lVar20 = 0;
      lVar24 = 0;
      pJVar22 = pJVar13;
      do {
        if (lVar24 != 0) {
          lVar25 = 0;
          do {
            UVar16 = *(UINT16 *)((long)pJVar13->quantval + lVar25);
            *(UINT16 *)((long)pJVar13->quantval + lVar25) = pJVar22->quantval[lVar25 * 4];
            pJVar22->quantval[lVar25 * 4] = UVar16;
            lVar25 = lVar25 + 2;
          } while (lVar20 != lVar25);
        }
        lVar24 = lVar24 + 1;
        pJVar22 = (JQUANT_TBL *)(pJVar22->quantval + 1);
        lVar20 = lVar20 + 2;
        pJVar13 = (JQUANT_TBL *)(pJVar13->quantval + 8);
      } while (lVar24 != 8);
    }
    lVar19 = lVar19 + 1;
  } while (lVar19 != 4);
LAB_00112fbb:
  pjVar7 = srcinfo->marker_list;
  if (((((pjVar7 != (jpeg_saved_marker_ptr_conflict)0x0) && (pjVar7->marker == 0xe1)) &&
       ((uVar18 = pjVar7->data_length, 5 < uVar18 &&
        ((pJVar8 = pjVar7->data, *pJVar8 == 'E' && (pJVar8[1] == 'x')))))) && (pJVar8[2] == 'i')) &&
     (((pJVar8[3] == 'f' && (pJVar8[4] == '\0')) && (pJVar8[5] == '\0')))) {
    dstinfo->write_JFIF_header = 0;
    if ((dstinfo->image_width != srcinfo->image_width) ||
       (dstinfo->image_height != srcinfo->image_height)) {
      adjust_exif_parameters(pJVar8 + 6,uVar18 - 6,dstinfo->image_width,dstinfo->image_height);
    }
  }
  if (info->workspace_coef_arrays != (jvirt_barray_ptr *)0x0) {
    src_coef_arrays = info->workspace_coef_arrays;
  }
  return src_coef_arrays;
}

Assistant:

GLOBAL(jvirt_barray_ptr *)
jtransform_adjust_parameters(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                             jvirt_barray_ptr *src_coef_arrays,
                             jpeg_transform_info *info)
{
  /* If force-to-grayscale is requested, adjust destination parameters */
  if (info->force_grayscale) {
    /* First, ensure we have YCbCr or grayscale data, and that the source's
     * Y channel is full resolution.  (No reasonable person would make Y
     * be less than full resolution, so actually coping with that case
     * isn't worth extra code space.  But we check it to avoid crashing.)
     */
    if (((dstinfo->jpeg_color_space == JCS_YCbCr &&
          dstinfo->num_components == 3) ||
         (dstinfo->jpeg_color_space == JCS_GRAYSCALE &&
          dstinfo->num_components == 1)) &&
        srcinfo->comp_info[0].h_samp_factor == srcinfo->max_h_samp_factor &&
        srcinfo->comp_info[0].v_samp_factor == srcinfo->max_v_samp_factor) {
      /* We use jpeg_set_colorspace to make sure subsidiary settings get fixed
       * properly.  Among other things, it sets the target h_samp_factor &
       * v_samp_factor to 1, which typically won't match the source.
       * We have to preserve the source's quantization table number, however.
       */
      int sv_quant_tbl_no = dstinfo->comp_info[0].quant_tbl_no;
      jpeg_set_colorspace(dstinfo, JCS_GRAYSCALE);
      dstinfo->comp_info[0].quant_tbl_no = sv_quant_tbl_no;
    } else {
      /* Sorry, can't do it */
      ERREXIT(dstinfo, JERR_CONVERSION_NOTIMPL);
    }
  } else if (info->num_components == 1) {
    /* For a single-component source, we force the destination sampling factors
     * to 1x1, with or without force_grayscale.  This is useful because some
     * decoders choke on grayscale images with other sampling factors.
     */
    dstinfo->comp_info[0].h_samp_factor = 1;
    dstinfo->comp_info[0].v_samp_factor = 1;
  }

  /* Correct the destination's image dimensions as necessary
   * for rotate/flip, resize, and crop operations.
   */
#if JPEG_LIB_VERSION >= 80
  dstinfo->jpeg_width = info->output_width;
  dstinfo->jpeg_height = info->output_height;
#endif

  /* Transpose destination image parameters, adjust quantization */
  switch (info->transform) {
  case JXFORM_TRANSPOSE:
  case JXFORM_TRANSVERSE:
  case JXFORM_ROT_90:
  case JXFORM_ROT_270:
#if JPEG_LIB_VERSION < 80
    dstinfo->image_width = info->output_height;
    dstinfo->image_height = info->output_width;
#endif
    transpose_critical_parameters(dstinfo);
    break;
  case JXFORM_DROP:
    if (info->drop_width != 0 && info->drop_height != 0)
      adjust_quant(srcinfo, src_coef_arrays,
                   info->drop_ptr, info->drop_coef_arrays,
                   info->trim, dstinfo);
    break;
  default:
#if JPEG_LIB_VERSION < 80
    dstinfo->image_width = info->output_width;
    dstinfo->image_height = info->output_height;
#endif
    break;
  }

  /* Adjust Exif properties */
  if (srcinfo->marker_list != NULL &&
      srcinfo->marker_list->marker == JPEG_APP0 + 1 &&
      srcinfo->marker_list->data_length >= 6 &&
      srcinfo->marker_list->data[0] == 0x45 &&
      srcinfo->marker_list->data[1] == 0x78 &&
      srcinfo->marker_list->data[2] == 0x69 &&
      srcinfo->marker_list->data[3] == 0x66 &&
      srcinfo->marker_list->data[4] == 0 &&
      srcinfo->marker_list->data[5] == 0) {
    /* Suppress output of JFIF marker */
    dstinfo->write_JFIF_header = FALSE;
    /* Adjust Exif image parameters */
#if JPEG_LIB_VERSION >= 80
    if (dstinfo->jpeg_width != srcinfo->image_width ||
        dstinfo->jpeg_height != srcinfo->image_height)
      /* Align data segment to start of TIFF structure for parsing */
      adjust_exif_parameters(srcinfo->marker_list->data + 6,
                             srcinfo->marker_list->data_length - 6,
                             dstinfo->jpeg_width, dstinfo->jpeg_height);
#else
    if (dstinfo->image_width != srcinfo->image_width ||
        dstinfo->image_height != srcinfo->image_height)
      /* Align data segment to start of TIFF structure for parsing */
      adjust_exif_parameters(srcinfo->marker_list->data + 6,
                             srcinfo->marker_list->data_length - 6,
                             dstinfo->image_width, dstinfo->image_height);
#endif
  }

  /* Return the appropriate output data set */
  if (info->workspace_coef_arrays != NULL)
    return info->workspace_coef_arrays;
  return src_coef_arrays;
}